

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O0

hrgls_MessageLevel __thiscall hrgls::Message::Level(Message *this)

{
  hrgls_Status hVar1;
  hrgls_MessageLevel local_1c;
  Message *pMStack_18;
  hrgls_MessageLevel ret;
  Message *this_local;
  
  local_1c = 0;
  if (this->m_private->Message == (hrgls_Message)0x0) {
    this->m_private->status = 0x3ee;
    this_local._4_4_ = 0;
  }
  else {
    pMStack_18 = this;
    hVar1 = hrgls_MessageGetLevel(this->m_private->Message,&local_1c);
    this->m_private->status = hVar1;
    this_local._4_4_ = local_1c;
  }
  return this_local._4_4_;
}

Assistant:

hrgls_MessageLevel Message::Level() const
  {
	  hrgls_MessageLevel ret = {};
	  if (!m_private->Message) {
		  m_private->status = hrgls_STATUS_NULL_OBJECT_POINTER;
		  return ret;
	  }
	  m_private->status = hrgls_MessageGetLevel(m_private->Message, &ret);
	  return ret;
  }